

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-macros.h
# Opt level: O2

void shift64RightJamming(uint64_t a,int count,uint64_t *zPtr)

{
  if (count != 0) {
    if (count < 0x40) {
      a = (ulong)(a << (-(byte)count & 0x3f) != 0) | a >> ((byte)count & 0x3f);
    }
    else {
      a = (uint64_t)(a != 0);
    }
  }
  *zPtr = a;
  return;
}

Assistant:

static inline void shift64RightJamming(uint64_t a, int count, uint64_t *zPtr)
{
    uint64_t z;

    if ( count == 0 ) {
        z = a;
    }
    else if ( count < 64 ) {
        z = ( a>>count ) | ( ( a<<( ( - count ) & 63 ) ) != 0 );
    }
    else {
        z = ( a != 0 );
    }
    *zPtr = z;

}